

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::JunitReporter::testRunStarting(JunitReporter *this,TestRunInfo *runInfo)

{
  TestRunInfo *in_RSI;
  CumulativeReporterBase *in_RDI;
  string *in_stack_ffffffffffffff98;
  allocator local_31;
  string local_30 [48];
  
  CumulativeReporterBase::testRunStarting(in_RDI,in_RSI);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,"testsuites",&local_31);
  XmlWriter::startElement((XmlWriter *)in_RDI,in_stack_ffffffffffffff98);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  return;
}

Assistant:

virtual void testRunStarting( TestRunInfo const& runInfo ) {
            CumulativeReporterBase::testRunStarting( runInfo );
            xml.startElement( "testsuites" );
        }